

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnswerLiteralManager.cpp
# Opt level: O3

Unit * __thiscall
Shell::AnswerLiteralManager::tryAddingAnswerLiteral(AnswerLiteralManager *this,Unit *unit)

{
  uint var;
  VList *vars;
  SList *srts;
  size_type sVar1;
  uint *puVar2;
  Symbol *this_00;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  uint function;
  size_type *psVar6;
  Literal *pLVar7;
  undefined4 *puVar8;
  undefined8 *puVar9;
  undefined4 *puVar10;
  Entry *pEVar11;
  OperatorKey *key;
  OperatorType *type;
  Term *__addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  uint uVar13;
  InferenceRule IVar14;
  void **head_2;
  AnswerLiteralManager *this_01;
  uint64_t *puVar15;
  void **head;
  Formula *f;
  void **head_1;
  pair<Kernel::Unit_*,_Kernel::Literal_*> val;
  Substitution subst;
  TermList sort;
  Formula *local_108;
  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
  *local_100;
  string local_f8;
  Formula *local_d8;
  Connective local_cc;
  Unit *local_c8;
  SList *local_c0;
  VList *local_b8;
  AnswerLiteralManager *local_b0;
  Inference local_a8;
  FormulaClauseTransformation local_70;
  Inference local_60;
  
  if ((((unit->field_0x4 & 1) != 0) &&
      (((undefined1  [48])unit->_inference & (undefined1  [48])0x18) == (undefined1  [48])0x8)) &&
     (**(int **)(unit + 1) == 6)) {
    local_d8 = *(Formula **)(*(int **)(unit + 1) + 10);
    local_cc = local_d8->_connective;
    f = local_d8;
    if ((local_cc == EXISTS) ||
       ((local_cc == FORALL &&
        (f = (Formula *)local_d8[1]._label._M_string_length, f->_connective == EXISTS)))) {
      vars = *(VList **)(f + 1);
      srts = (SList *)f[1]._label._M_dataplus._M_p;
      sVar1 = f[1]._label._M_string_length;
      this_01 = (AnswerLiteralManager *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
      psVar6 = (size_type *)
               Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      *psVar6 = sVar1;
      psVar6[1] = 0;
      local_c0 = srts;
      local_b8 = vars;
      pLVar7 = getAnswerLiteral(this_01,vars,srts,f);
      val.second = pLVar7;
      val.first = unit;
      local_c8 = unit;
      local_b0 = this;
      Lib::
      DHMap<unsigned_int,_std::pair<Kernel::Unit_*,_Kernel::Literal_*>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::insert(&this->_originUnitsAndInjectedLiterals,(pLVar7->super_Term)._functor,val);
      puVar8 = (undefined4 *)
               Lib::FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      *puVar8 = 0;
      *(undefined4 **)(puVar8 + 2) = puVar8 + 6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar8 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Literal **)(puVar8 + 10) = pLVar7;
      puVar9 = (undefined8 *)
               Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      *puVar9 = puVar8;
      puVar9[1] = psVar6;
      local_108 = (Formula *)
                  Lib::FixedSizeAllocator<48UL>::alloc
                            ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                            );
      puVar8 = (undefined4 *)
               Lib::FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      puVar10 = (undefined4 *)
                Lib::FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      *puVar10 = 1;
      *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(undefined8 **)(puVar10 + 10) = puVar9;
      *puVar8 = 8;
      *(undefined4 **)(puVar8 + 2) = puVar8 + 6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar8 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(VList **)(puVar8 + 10) = local_b8;
      *(SList **)(puVar8 + 0xc) = local_c0;
      *(undefined4 **)(puVar8 + 0xe) = puVar10;
      local_108->_connective = NOT;
      (local_108->_label)._M_dataplus._M_p = (pointer)&(local_108->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(undefined4 **)(local_108 + 1) = puVar8;
      IVar14 = ANSWER_LITERAL_INJECTION;
      if (local_cc != EXISTS) {
        local_a8._0_4_ = local_c8->_number;
        pEVar11 = Lib::
                  DHMap<unsigned_int,_Lib::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::findEntry(&Parse::TPTP::_questionVariableNames_abi_cxx11_,(uint *)&local_a8);
        if (pEVar11 == (Entry *)0x0) {
          local_100 = (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
                       *)0x0;
        }
        else {
          local_100 = pEVar11->_val;
        }
        puVar2 = *(uint **)(local_d8 + 1);
        puVar15 = (uint64_t *)local_d8[1]._label._M_dataplus._M_p;
        local_a8._0_4_ = 1;
        local_a8._4_4_ = 0;
        local_a8._8_4_ = 0;
        local_a8._age = 0;
        local_a8._splits._0_4_ = 0;
        local_a8._splits._4_4_ = 0;
        local_a8._ptr1._0_4_ = 0;
        local_a8._ptr1._4_4_ = 0;
        local_a8._ptr2._0_4_ = 0;
        local_a8._ptr2._4_4_ = 0;
        while (puVar2 != (uint *)0x0) {
          var = *puVar2;
          puVar2 = *(uint **)(puVar2 + 2);
          function = Kernel::Signature::addSkolemFunction(DAT_00b521b0,0,"in",true);
          this_00 = (DAT_00b521b0->_funs)._stack[function];
          local_60._0_8_ = 2;
          uVar13 = function;
          if (puVar15 == (uint64_t *)0x0) {
            bVar5 = Kernel::SortHelper::tryGetVariableSort(var,local_d8,(TermList *)&local_60);
            if (!bVar5) {
              local_60._0_8_ = Kernel::AtomicSort::defaultSort();
            }
            puVar15 = (uint64_t *)0x0;
          }
          else {
            local_60._0_8_ = *puVar15;
            puVar15 = (uint64_t *)puVar15[1];
          }
          uVar4 = local_60._0_8_;
          key = Kernel::OperatorType::setupKey(0,(TermList *)0x0);
          *(undefined8 *)(key + 8) = uVar4;
          type = Kernel::OperatorType::getTypeFromKey(key,0);
          Kernel::Signature::Symbol::setType(this_00,type);
          __addr = Kernel::Term::create(function,0,(TermList *)0x0);
          Kernel::Substitution::bind((Substitution *)&local_a8,var,(sockaddr *)__addr,uVar13);
          if (local_100 ==
              (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
               *)0x0) {
            local_70._0_8_ = ZEXT48(var * 4 + 1);
            Kernel::TermList::toString_abi_cxx11_(&local_f8,(TermList *)&local_70,false);
          }
          else {
            pbVar12 = Lib::
                      Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash>
                      ::get(local_100,var);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            pcVar3 = (pbVar12->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f8,pcVar3,pcVar3 + pbVar12->_M_string_length);
          }
          (*local_b0->_vptr_AnswerLiteralManager[6])(local_b0,__addr,(ulong)var,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        local_108 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                              (local_108,(Substitution *)&local_a8,false);
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   &local_a8);
        IVar14 = ANSWER_LITERAL_INPUT_SKOLEMISATION;
      }
      unit = (Unit *)::operator_new(0x48,8);
      local_70.rule = IVar14;
      local_70.premise = local_c8;
      Kernel::Inference::Inference(&local_60,&local_70);
      local_a8._ptr2._0_4_ = SUB84(local_60._ptr2,0);
      local_a8._ptr2._4_4_ = (undefined4)((ulong)local_60._ptr2 >> 0x20);
      local_a8.th_ancestors = local_60.th_ancestors;
      local_a8.all_ancestors = local_60.all_ancestors;
      local_a8._splits._0_4_ = SUB84(local_60._splits,0);
      local_a8._splits._4_4_ = (undefined4)((ulong)local_60._splits >> 0x20);
      local_a8._ptr1._0_4_ = SUB84(local_60._ptr1,0);
      local_a8._ptr1._4_4_ = (undefined4)((ulong)local_60._ptr1 >> 0x20);
      local_a8._0_4_ = local_60._0_4_;
      local_a8._4_4_ = local_60._4_4_;
      local_a8._8_4_ = local_60._8_4_;
      local_a8._age = local_60._age;
      Kernel::Unit::Unit(unit,FORMULA,&local_a8);
      *(Formula **)(unit + 1) = local_108;
      *(undefined8 *)&unit[1]._inference = 3;
      Kernel::Unit::doUnitTracing(unit);
    }
  }
  return unit;
}

Assistant:

Clause* AnswerLiteralResolver::simplify(Clause* cl)
{
  if (isProperAnswerClause(cl)) {
    return AnswerLiteralManager::getInstance()->getRefutation(cl);
  }
  return cl;
}